

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::removeRowRange(SPxLPBase<double> *this,int start,int end,int *perm)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint p_size;
  DataArray<int> p;
  DataArray<int> DStack_38;
  
  if (perm != (int *)0x0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)start;
    if (start < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      perm[uVar2] = (int)uVar2;
    }
    for (; (long)uVar3 <= (long)end; uVar3 = uVar3 + 1) {
      perm[uVar3] = -1;
    }
    for (; (long)uVar3 < (long)(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum
        ; uVar3 = uVar3 + 1) {
      perm[uVar3] = (int)uVar3;
    }
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x11])(this,perm);
    return;
  }
  p_size = (end - start) + 1;
  DataArray<int>::DataArray(&DStack_38,p_size,0,1.2);
  uVar1 = p_size;
  while (0 < (int)uVar1) {
    uVar1 = uVar1 - 1;
    DStack_38.data[uVar1] = end;
    end = end + -1;
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x13])
            (this,DStack_38.data,(ulong)p_size,0);
  DataArray<int>::~DataArray(&DStack_38);
  return;
}

Assistant:

virtual void removeRowRange(int start, int end, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         int i = end - start + 1;
         DataArray < int > p(i);

         while(--i >= 0)
            p[i] = start + i;

         removeRows(p.get_ptr(), end - start + 1);
         return;
      }

      int i;

      for(i = 0; i < start; ++i)
         perm[i] = i;

      for(; i <= end; ++i)
         perm[i] = -1;

      for(; i < nRows(); ++i)
         perm[i] = i;

      removeRows(perm);
   }